

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restclient.cpp
# Opt level: O0

void __thiscall YdiskRestClient::cleanTrash(YdiskRestClient *this)

{
  SSLClient *path;
  Headers *headers;
  element_type *peVar1;
  element_type *peVar2;
  undefined1 local_58 [8];
  shared_ptr<httplib::Response> r;
  allocator local_31;
  string local_30 [8];
  string url;
  YdiskRestClient *this_local;
  
  url.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"/v1/disk/trash/resources",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  path = this->http_client;
  headers = (Headers *)std::__cxx11::string::c_str();
  httplib::Client::Delete((Client *)local_58,(char *)path,headers);
  peVar1 = std::__shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2> *)local_58);
  if ((peVar1 == (element_type *)0x0) ||
     (peVar2 = std::__shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_58), peVar2->status != 0xcc)) {
    peVar1 = std::__shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2> *)local_58);
    if ((peVar1 == (element_type *)0x0) ||
       (peVar2 = std::
                 __shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_58), peVar2->status != 0xca)) {
      peVar1 = std::__shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2> *)local_58);
      throw_response_error(this,peVar1);
    }
    else {
      peVar2 = std::__shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_58);
      wait_success_operation(this,&peVar2->body);
    }
  }
  std::shared_ptr<httplib::Response>::~shared_ptr((shared_ptr<httplib::Response> *)local_58);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void YdiskRestClient::cleanTrash()
{
    std::string url("/v1/disk/trash/resources");
    auto r = http_client->Delete(url.c_str(), headers);

    if(r.get() && r->status==204){
        return;
    } else if(r.get() && r->status==202){
        //not empty folder is removing, get operation status
        wait_success_operation(r->body);
        return;
    } else {
        throw_response_error(r.get());
    }
}